

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::paintEvent(QWizard *this,QPaintEvent *event)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  char cVar4;
  int iVar5;
  QWizardPage *pQVar6;
  long in_FS_OFFSET;
  undefined1 *local_68;
  QWidget *pQStack_60;
  QStyle *local_58;
  undefined1 local_48 [16];
  undefined1 *local_38;
  QWidgetData *local_28;
  
  local_28 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if ((*(int *)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 900) == 2) &&
     (pQVar6 = currentPage(this), pQVar6 != (QWizardPage *)0x0)) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = currentPage(this);
    QWizardPage::pixmap((QWizardPage *)local_48,(WizardPixmap)pQVar6);
    cVar4 = QPixmap::isNull();
    if (cVar4 == '\0') {
      local_58 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      QStylePainter::QStylePainter((QStylePainter *)&local_68,(QWidget *)this);
      pQVar3 = (this->super_QDialog).super_QWidget.data;
      iVar1 = (pQVar3->crect).y1.m_i;
      iVar2 = (pQVar3->crect).y2.m_i;
      iVar5 = QPixmap::height();
      QPainter::drawPixmap
                ((QPainter *)&local_68,0,((iVar2 - (iVar5 + iVar1)) + 1) / 2,(QPixmap *)local_48);
      QPainter::~QPainter((QPainter *)&local_68);
    }
    QPixmap::~QPixmap((QPixmap *)local_48);
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::paintEvent(QPaintEvent * event)
{
    Q_D(QWizard);
    if (d->wizStyle == MacStyle && currentPage()) {
        QPixmap backgroundPixmap = currentPage()->pixmap(BackgroundPixmap);
        if (backgroundPixmap.isNull())
            return;

        QStylePainter painter(this);
        painter.drawPixmap(0, (height() - backgroundPixmap.height()) / 2, backgroundPixmap);
    }
#if QT_CONFIG(style_windowsvista)
    else if (d->isVistaThemeEnabled()) {
        d->vistaHelper->paintEvent(event);
    }
#else
    Q_UNUSED(event);
#endif
}